

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

int32_t __thiscall
absl::synchronization_internal::anon_unknown_0::PointerMap::Find(PointerMap *this,void *ptr)

{
  uint uVar1;
  Node *pNVar2;
  
  pNVar2 = (Node *)((this->table_)._M_elems + ((ulong)ptr % 0x3fffb - 2));
  do {
    uVar1 = pNVar2->next_hash;
    if ((ulong)uVar1 == 0xffffffff) {
      return uVar1;
    }
    pNVar2 = this->nodes_->ptr_[uVar1];
  } while ((pNVar2->masked_ptr ^ (ulong)ptr) != 0xf03a5f7bf03a5f7b);
  return uVar1;
}

Assistant:

int32_t Find(void* ptr) {
    auto masked = base_internal::HidePtr(ptr);
    for (int32_t i = table_[Hash(ptr)]; i != -1;) {
      Node* n = (*nodes_)[static_cast<uint32_t>(i)];
      if (n->masked_ptr == masked) return i;
      i = n->next_hash;
    }
    return -1;
  }